

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseSubExpression
          (Parser *this,bitmask<slang::parsing::detail::ExpressionOptions> options,int precedence)

{
  bool bVar1;
  SyntaxKind kind;
  ulong uVar2;
  TimingControlSyntax *timing;
  ExpressionSyntax *pEVar3;
  TimingControlExpressionSyntax *lhs;
  TaggedUnionExpressionSyntax *pTVar4;
  PrefixUnaryExpressionSyntax *left;
  SyntaxNode *this_00;
  ScopedNameSyntax *pSVar5;
  NameSyntax *newKeyword;
  SyntaxNode *this_01;
  Token TVar6;
  Token member;
  Token TVar7;
  AttrList AVar8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_60;
  
  uVar2 = this->recursionDepth + 1;
  this->recursionDepth = uVar2;
  if ((this->parseOptions).maxRecursionDepth < uVar2) {
    handleTooDeep(this);
  }
  TVar6 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isPossibleDelayOrEventControl(TVar6.kind);
  if (bVar1) {
    timing = parseTimingControl(this);
    if (timing == (TimingControlSyntax *)0x0) {
      assert::assertFailed
                ("timingControl",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Parser_expressions.cpp"
                 ,0x38,
                 "ExpressionSyntax &slang::parsing::Parser::parseSubExpression(bitmask<ExpressionOptions>, int)"
                );
    }
    pEVar3 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
    lhs = slang::syntax::SyntaxFactory::timingControlExpression(&this->factory,timing,pEVar3);
    pTVar4 = (TaggedUnionExpressionSyntax *)
             parsePostfixExpression(this,&lhs->super_ExpressionSyntax,options);
  }
  else if ((TVar6._0_4_ & 0xffff) == 0x129) {
    TVar6 = ParserBase::consume(&this->super_ParserBase);
    member = ParserBase::expect(&this->super_ParserBase,Identifier);
    TVar7 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar7.kind);
    if (bVar1) {
      pEVar3 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
    }
    else {
      pEVar3 = (ExpressionSyntax *)0x0;
    }
    pTVar4 = slang::syntax::SyntaxFactory::taggedUnionExpression(&this->factory,TVar6,member,pEVar3)
    ;
  }
  else {
    kind = slang::syntax::SyntaxFacts::getUnaryPrefixExpression(TVar6.kind);
    if (kind == Unknown) {
      this_00 = &parsePrimaryExpression(this,options)->super_SyntaxNode;
      this_01 = this_00;
      while (this_01->kind == ScopedName) {
        pSVar5 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(this_01);
        this_01 = (SyntaxNode *)(pSVar5->right).ptr;
        if (this_01 == (SyntaxNode *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::NameSyntax *>::get() const [T = slang::syntax::NameSyntax *]"
                    );
        }
      }
      if (this_01->kind == ConstructorName) {
        newKeyword = slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(this_00);
        pTVar4 = (TaggedUnionExpressionSyntax *)parseNewExpression(this,newKeyword,options);
        goto LAB_0033365e;
      }
      left = (PrefixUnaryExpressionSyntax *)
             parsePostfixExpression(this,(ExpressionSyntax *)this_00,options);
    }
    else {
      TVar6 = ParserBase::consume(&this->super_ParserBase);
      AVar8 = parseAttributes(this);
      pEVar3 = parsePrimaryExpression(this,options);
      pEVar3 = parsePostfixExpression(this,pEVar3,options);
      local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00508348;
      local_60.super_SyntaxListBase.childCount = AVar8.size_;
      local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> = AVar8;
      left = slang::syntax::SyntaxFactory::prefixUnaryExpression
                       (&this->factory,kind,TVar6,&local_60,pEVar3);
    }
    pTVar4 = (TaggedUnionExpressionSyntax *)
             parseBinaryExpression
                       (this,&left->super_ExpressionSyntax,
                        (bitmask<slang::parsing::detail::ExpressionOptions>)(options.m_bits & 0xf7),
                        precedence);
  }
LAB_0033365e:
  this->recursionDepth = this->recursionDepth - 1;
  return &pTVar4->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseSubExpression(bitmask<ExpressionOptions> options, int precedence) {
    auto dg = setDepthGuard();

    auto current = peek();
    if (isPossibleDelayOrEventControl(current.kind)) {
        auto timingControl = parseTimingControl();
        ASSERT(timingControl);

        auto& expr = factory.timingControlExpression(*timingControl, parseExpression());
        return parsePostfixExpression(expr, options);
    }
    else if (current.kind == TokenKind::TaggedKeyword) {
        auto tagged = consume();
        auto member = expect(TokenKind::Identifier);

        ExpressionSyntax* expr = nullptr;
        if (isPossibleExpression(peek().kind))
            expr = &parseExpression();

        return factory.taggedUnionExpression(tagged, member, expr);
    }

    ExpressionSyntax* leftOperand;
    SyntaxKind opKind = getUnaryPrefixExpression(current.kind);
    if (opKind != SyntaxKind::Unknown) {
        auto opToken = consume();
        auto attributes = parseAttributes();

        auto& operand = parsePrimaryExpression(options);
        auto& postfix = parsePostfixExpression(operand, options);
        leftOperand = &factory.prefixUnaryExpression(opKind, opToken, attributes, postfix);
    }
    else {
        leftOperand = &parsePrimaryExpression(options);

        // If the primary is a new or scoped new operator we should handle
        // that separately (it doesn't participate in postfix expression parsing).
        if (isNewExpr(leftOperand))
            return parseNewExpression(leftOperand->as<NameSyntax>(), options);

        leftOperand = &parsePostfixExpression(*leftOperand, options);
    }

    options &= ~ExpressionOptions::AllowSuperNewCall;
    return parseBinaryExpression(leftOperand, options, precedence);
}